

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int mmi_rand_train(model_inventory_t *inv,model_def_t *mdef,lexicon_t *lex,vector_t **f,
                  s3lattice_t *lat,float64 a_beam,uint32 mean_reest,uint32 var_reest,feat_t *fcb)

{
  uint32 uVar1;
  uint32 uVar2;
  lexicon_t *plVar3;
  model_inventory_t *pmVar4;
  int iVar5;
  int32 iVar6;
  time_t tVar7;
  ulong uVar8;
  acmod_id_t *paVar9;
  state_t *psVar10;
  vector_t **feature;
  acmod_id_t *paVar11;
  s3arc_s *psVar12;
  ulong uVar13;
  uint n_obs;
  vector_t **pppfVar14;
  int iVar15;
  vector_t **pppfVar16;
  bool bVar17;
  uint32 n_state;
  acmod_id_t *local_218;
  s3lattice_t *local_210;
  vector_t **local_208;
  lexicon_t *local_200;
  acmod_id_t *local_1f8;
  uint32 local_1ec;
  vector_t **local_1e8;
  model_inventory_t *local_1e0;
  model_def_t *local_1d8;
  float64 local_1d0;
  ulong local_1c8;
  float64 log_lik;
  char nword [128];
  char pword [128];
  char cword [128];
  
  n_state = 0;
  local_200 = lex;
  local_1ec = mean_reest;
  local_1e0 = inv;
  local_1d8 = mdef;
  local_1d0 = a_beam;
  printf(" %5u",(ulong)lat->n_arcs);
  uVar13 = 0;
  local_210 = lat;
  local_1e8 = f;
  while (pppfVar16 = local_1e8, uVar13 < lat->n_arcs) {
    paVar9 = (acmod_id_t *)(ulong)((lat->arc[uVar13].ef - lat->arc[uVar13].sf) + 1);
    local_1c8 = uVar13;
    local_208 = (vector_t **)
                __ckd_calloc__((size_t)paVar9,8,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                               ,0x45b);
    for (paVar11 = (acmod_id_t *)0x0; psVar12 = lat->arc, paVar9 != paVar11;
        paVar11 = (acmod_id_t *)((long)paVar11 + 1)) {
      local_208[(long)paVar11] = pppfVar16[(psVar12[uVar13].sf + (int)paVar11) - 1];
    }
    iVar15 = psVar12[uVar13].n_next_arcs * psVar12[uVar13].n_prev_arcs;
    local_1f8 = paVar9;
    tVar7 = time((time_t *)0x0);
    srand((uint)tVar7);
    while( true ) {
      bVar17 = iVar15 == 0;
      iVar15 = iVar15 + -1;
      if ((bVar17) || (psVar12 = lat->arc, psVar12[uVar13].good_arc != 0)) break;
      if (psVar12[uVar13].n_prev_arcs == 1) {
        uVar8 = 0;
      }
      else {
        iVar5 = rand();
        psVar12 = lat->arc;
        uVar8 = (long)((double)psVar12[uVar13].n_prev_arcs * (double)iVar5 * 4.656612873077393e-10)
                & 0xffffffff;
      }
      local_218 = (acmod_id_t *)(ulong)psVar12[uVar13].prev_arcs[uVar8];
      if (psVar12[uVar13].n_next_arcs == 1) {
        uVar8 = 0;
      }
      else {
        iVar5 = rand();
        psVar12 = lat->arc;
        uVar8 = (long)((double)psVar12[uVar13].n_next_arcs * (double)iVar5 * 4.656612873077393e-10)
                & 0xffffffff;
      }
      uVar1 = psVar12[uVar13].next_arcs[uVar8];
      strcpy(cword,psVar12[uVar13].word);
      if ((int)local_218 == 0) {
        builtin_strncpy(pword,"<s>",4);
      }
      else {
        strcpy(pword,psVar12[(int)local_218 - 1].word);
      }
      paVar11 = mk_boundary_phone(pword,0,local_200);
      if (uVar1 == 0) {
        builtin_strncpy(nword,"</s>",5);
      }
      else {
        strcpy(nword,lat->arc[uVar1 - 1].word);
      }
      plVar3 = local_200;
      paVar9 = mk_boundary_phone(nword,1,local_200);
      pmVar4 = local_1e0;
      psVar10 = next_utt_states_mmie(&n_state,plVar3,local_1e0,local_1d8,cword,paVar11,paVar9);
      iVar6 = mmi_viterbi_run(&log_lik,local_208,(uint32)local_1f8,psVar10,n_state,pmVar4,local_1d0)
      ;
      if (iVar6 == 0) {
        psVar12 = local_210->arc;
        psVar12[uVar13].good_arc = 1;
        psVar12[uVar13].ac_score = log_lik;
        psVar12[uVar13].best_prev_arc = (uint32)local_218;
        psVar12[uVar13].best_next_arc = uVar1;
      }
      ckd_free(paVar11);
      ckd_free(paVar9);
      lat = local_210;
    }
    ckd_free(local_208);
    uVar8 = local_1c8;
    if (lat->arc[uVar13].good_arc == 0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
              ,0x49e,"arc_%d is ignored (viterbi run failed)\n",(ulong)((int)local_1c8 + 1));
    }
    uVar13 = uVar8 + 1;
  }
  lat_fwd_bwd(lat);
  for (pppfVar14 = (vector_t **)0x0; pppfVar14 < (ulong)lat->n_arcs;
      pppfVar14 = (vector_t **)((long)pppfVar14 + 1)) {
    psVar12 = lat->arc;
    if (psVar12[(long)pppfVar14].good_arc == 1) {
      n_obs = (psVar12[(long)pppfVar14].ef - psVar12[(long)pppfVar14].sf) + 1;
      local_208 = pppfVar14;
      feature = (vector_t **)
                __ckd_calloc__((ulong)n_obs,8,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                               ,0x4ad);
      for (uVar13 = 0; psVar12 = lat->arc, n_obs != uVar13; uVar13 = uVar13 + 1) {
        feature[uVar13] = pppfVar16[(psVar12[(long)pppfVar14].sf + (int)uVar13) - 1];
        lat = local_210;
      }
      uVar1 = psVar12[(long)pppfVar14].best_prev_arc;
      uVar2 = psVar12[(long)pppfVar14].best_next_arc;
      strcpy(cword,psVar12[(long)pppfVar14].word);
      if (uVar1 == 0) {
        builtin_strncpy(pword,"<s>",4);
      }
      else {
        strcpy(pword,psVar12[uVar1 - 1].word);
      }
      lat = local_210;
      local_218 = mk_boundary_phone(pword,0,local_200);
      pppfVar16 = local_1e8;
      if (uVar2 == 0) {
        builtin_strncpy(nword,"</s>",5);
      }
      else {
        strcpy(nword,lat->arc[uVar2 - 1].word);
      }
      plVar3 = local_200;
      local_1f8 = mk_boundary_phone(nword,1,local_200);
      pmVar4 = local_1e0;
      psVar10 = next_utt_states_mmie(&n_state,plVar3,local_1e0,local_1d8,cword,local_218,local_1f8);
      iVar6 = mmi_viterbi_update(feature,n_obs,psVar10,n_state,pmVar4,local_1d0,local_1ec,var_reest,
                                 lat->arc[(long)pppfVar14].gamma,fcb);
      pppfVar14 = local_208;
      if (iVar6 != 0) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                ,0x4ce,"arc_%d is ignored (viterbi update failed)\n",(ulong)((int)local_208 + 1));
      }
      ckd_free(feature);
      ckd_free(local_218);
      ckd_free(local_1f8);
    }
  }
  return 0;
}

Assistant:

int
mmi_rand_train(model_inventory_t *inv,
	       model_def_t *mdef,
	       lexicon_t *lex,
	       vector_t **f,
	       s3lattice_t *lat,
	       float64 a_beam,
	       uint32 mean_reest,
	       uint32 var_reest,
	       feat_t *fcb)
{
  uint32 k, n;
  uint32 n_rand;/* random number */
  uint32 n_max_run;/* the maximum number of viterbi run */
  char pword[128], cword[128], nword[128];      /* previous, current, next word */
  vector_t **arc_f = NULL;/* feature vector for a word arc */
  uint32 n_word_obs;/* frames of a word arc */
  uint32 rand_prev_id, rand_next_id;/* randomly selected previous and next arc id */
  uint32 *lphone, *rphone;        /* the last and first phone of previous and next word hypothesis */
  state_t *state_seq;/* HMM state sequence for an arc */
  uint32 n_state = 0;/* number of HMM states */
  float64 log_lik;/* log-likelihood of an arc */
  
  /* viterbi run on each arc */
  printf(" %5u", lat->n_arcs);
  
  for(n=0; n<lat->n_arcs; n++) {

    /* total observations of this arc */
    /* this is not very accurate, as it consumes one more frame for each word at the end */
    n_word_obs = lat->arc[n].ef - lat->arc[n].sf + 1;
    
    /* get the feature for this arc */
    arc_f = (vector_t **) ckd_calloc(n_word_obs, sizeof(vector_t *));
    for (k=0; k<n_word_obs; k++)
      arc_f[k] = f[k+lat->arc[n].sf-1];
    
    /* in case the viterbi run fails at a certain left and right context,
       at most randomly pick context n_prev_arcs * n_next_arcs times */
    n_max_run = lat->arc[n].n_prev_arcs * lat->arc[n].n_next_arcs;
    
    /* seed the random-number generator with current time */
    srand( (unsigned)time( NULL ) );
    
    /* randomly pick the left and right context */
    while (n_max_run > 0 && lat->arc[n].good_arc == 0) {
      
      /* get left arc id */
      if (lat->arc[n].n_prev_arcs == 1) {
	n_rand = 0;
      }
      else {
	n_rand = (uint32) (((double) rand() / (((double) RAND_MAX) + 1)) * lat->arc[n].n_prev_arcs );
      }
      rand_prev_id = lat->arc[n].prev_arcs[n_rand];

      /* get right arc id */
      if (lat->arc[n].n_next_arcs == 1) {
	n_rand = 0;
      }
      else {
	n_rand = (uint32) (((double) rand() / (((double) RAND_MAX) + 1)) * lat->arc[n].n_next_arcs );
      }
      rand_next_id = lat->arc[n].next_arcs[n_rand];
      
      /* get the triphone list */
      strcpy(cword, lat->arc[n].word);
      if (rand_prev_id == 0)
	strcpy(pword, "<s>");
      else
	strcpy(pword, lat->arc[rand_prev_id-1].word);
      lphone = mk_boundary_phone(pword, 0, lex);
      if (rand_next_id == 0)
	strcpy(nword, "</s>");
      else
	strcpy(nword, lat->arc[rand_next_id-1].word);
      rphone = mk_boundary_phone(nword, 1, lex);

      state_seq = next_utt_states_mmie(&n_state, lex, inv, mdef, cword, lphone, rphone);

      /* viterbi compuation to get the acoustic score for a word hypothesis */
      if (mmi_viterbi_run(&log_lik,
			  arc_f, n_word_obs,
			  state_seq, n_state,
			  inv,
			  a_beam) == S3_SUCCESS) {
	lat->arc[n].good_arc = 1;
	lat->arc[n].ac_score = log_lik;
	lat->arc[n].best_prev_arc = rand_prev_id;
	lat->arc[n].best_next_arc = rand_next_id;
      }

      n_max_run--;
      ckd_free(lphone);
      ckd_free(rphone);
    }
    
    ckd_free(arc_f);
    
    if (lat->arc[n].good_arc == 0) {
      E_INFO("arc_%d is ignored (viterbi run failed)\n", n+1);
    }
  }

  /* lattice-based forward-backward computation */
  lat_fwd_bwd(lat);

  /* update Gaussian parameters */
  for (n=0; n<lat->n_arcs; n++) {
    
    /* only if the arc was successful in viterbi run */
    if (lat->arc[n].good_arc == 1) {
      
      /* total observations of this arc */
      n_word_obs = lat->arc[n].ef - lat->arc[n].sf + 1;
      arc_f = (vector_t **) ckd_calloc(n_word_obs, sizeof(vector_t *));
      for (k=0; k<n_word_obs; k++)
	arc_f[k] = f[k+lat->arc[n].sf-1];
      
      /* get the randomly picked left and right context */
      rand_prev_id = lat->arc[n].best_prev_arc;
      rand_next_id = lat->arc[n].best_next_arc;
      
      /* get the triphone list */
      strcpy(cword, lat->arc[n].word);
      if (rand_prev_id == 0)
	strcpy(pword, "<s>");
      else
	strcpy(pword, lat->arc[rand_prev_id-1].word);
      lphone = mk_boundary_phone(pword, 0, lex);
      if (rand_next_id == 0)
	strcpy(nword, "</s>");
      else
	strcpy(nword, lat->arc[rand_next_id-1].word);
      rphone = mk_boundary_phone(nword, 1, lex);
      
      /* make state list */
      state_seq = next_utt_states_mmie(&n_state, lex, inv, mdef, cword, lphone, rphone);
      
      /* viterbi update model parameters */
      if (mmi_viterbi_update(arc_f, n_word_obs,
			     state_seq, n_state,
			     inv,
			     a_beam,
			     mean_reest,
			     var_reest,
			     lat->arc[n].gamma,
			     fcb) != S3_SUCCESS) {
	E_ERROR("arc_%d is ignored (viterbi update failed)\n", n+1);
      }
      ckd_free(arc_f);
      ckd_free(lphone);
      ckd_free(rphone);
    }
  }
  
  return S3_SUCCESS;
}